

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O2

int KnownRank(pyhanabi_card_knowledge_t *knowledge)

{
  uint __line;
  char *__assertion;
  
  if (knowledge == (pyhanabi_card_knowledge_t *)0x0) {
    __assertion = "knowledge != nullptr";
    __line = 0x5b;
  }
  else {
    if (knowledge->knowledge != (void *)0x0) {
      return *(int *)((long)knowledge->knowledge + 0x30);
    }
    __assertion = "knowledge->knowledge != nullptr";
    __line = 0x5c;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,__line,"int KnownRank(pyhanabi_card_knowledge_t *)");
}

Assistant:

int KnownRank(pyhanabi_card_knowledge_t* knowledge) {
  REQUIRE(knowledge != nullptr);
  REQUIRE(knowledge->knowledge != nullptr);
  return reinterpret_cast<
             const hanabi_learning_env::HanabiHand::CardKnowledge*>(
             knowledge->knowledge)
      ->Rank();
}